

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O0

void __thiscall
btMultiBody::solveImatrix(btMultiBody *this,btVector3 *rhs_top,btVector3 *rhs_bot,float *result)

{
  btScalar *pbVar1;
  btVector3 *pbVar2;
  btScalar *in_RCX;
  btVector3 *in_RDX;
  btVector3 *in_RSI;
  btMatrix3x3 *in_RDI;
  btVector3 bVar3;
  btVector3 vbot;
  btVector3 tmp_1;
  btVector3 vtop;
  btMatrix3x3 invI_lower_left;
  btMatrix3x3 invI_lower_right;
  btMatrix3x3 invI_upper_left;
  btMatrix3x3 invIupper_right;
  btMatrix3x3 tmp;
  btMatrix3x3 Binv;
  int num_links;
  btVector3 *v;
  btMatrix3x3 *m;
  btScalar *in_stack_fffffffffffffd38;
  btMatrix3x3 *in_stack_fffffffffffffd40;
  btMatrix3x3 *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  btScalar bVar4;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  btMatrix3x3 *in_stack_fffffffffffffd88;
  btMatrix3x3 *in_stack_fffffffffffffd90;
  btVector3 local_258;
  btVector3 local_248 [4];
  btMatrix3x3 local_208 [3];
  btMatrix3x3 local_178 [2];
  btVector3 local_118 [6];
  btMatrix3x3 local_b8;
  undefined4 local_88;
  int local_24;
  btScalar *local_20;
  btVector3 *local_18;
  btVector3 *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_24 = getNumLinks((btMultiBody *)0x23ed1c);
  if (local_24 == 0) {
    pbVar1 = btVector3::operator_cast_to_float_(local_18);
    bVar4 = *pbVar1;
    pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI[1].m_el[0].m_floats + 3));
    *local_20 = bVar4 / *pbVar1;
    pbVar1 = btVector3::operator_cast_to_float_(local_18);
    bVar4 = pbVar1[1];
    pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI[1].m_el[0].m_floats + 3));
    local_20[1] = bVar4 / pbVar1[1];
    pbVar1 = btVector3::operator_cast_to_float_(local_18);
    bVar4 = pbVar1[2];
    pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI[1].m_el[0].m_floats + 3));
    local_20[2] = bVar4 / pbVar1[2];
    pbVar1 = btVector3::operator_cast_to_float_(local_10);
    local_20[3] = *pbVar1 / in_RDI[1].m_el[0].m_floats[2];
    pbVar1 = btVector3::operator_cast_to_float_(local_10);
    local_20[4] = pbVar1[1] / in_RDI[1].m_el[0].m_floats[2];
    pbVar1 = btVector3::operator_cast_to_float_(local_10);
    local_20[5] = pbVar1[2] / in_RDI[1].m_el[0].m_floats[2];
  }
  else {
    btMatrix3x3::inverse
              ((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    local_88 = 0xbf800000;
    ::operator*(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    m = in_RDI + 10;
    ::operator*(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    ::operator*(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    v = local_118;
    operator+(in_RDI,(btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    btMatrix3x3::inverse
              ((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    ::operator*(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    btMatrix3x3::operator=(&local_b8,local_178);
    ::operator*(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    btMatrix3x3::transpose(in_stack_fffffffffffffd50);
    ::operator*(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    btMatrix3x3::operator=(&local_b8,local_208);
    pbVar2 = btMatrix3x3::operator[](&local_b8,0);
    pbVar1 = btVector3::operator_cast_to_float_(pbVar2);
    *pbVar1 = *pbVar1 - 1.0;
    pbVar2 = btMatrix3x3::operator[](&local_b8,1);
    pbVar1 = btVector3::operator_cast_to_float_(pbVar2);
    pbVar1[1] = pbVar1[1] - 1.0;
    pbVar2 = btMatrix3x3::operator[](&local_b8,2);
    pbVar1 = btVector3::operator_cast_to_float_(pbVar2);
    pbVar1[2] = pbVar1[2] - 1.0;
    ::operator*(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    bVar3 = ::operator*(m,v);
    local_248[0].m_floats._8_8_ = bVar3.m_floats._8_8_;
    local_248[0].m_floats._0_8_ = bVar3.m_floats._0_8_;
    btVector3::btVector3(&local_258);
    bVar3 = ::operator*(m,v);
    local_258.m_floats._8_8_ = bVar3.m_floats._8_8_;
    local_258.m_floats._0_8_ = bVar3.m_floats._0_8_;
    btVector3::operator+=(local_248,&local_258);
    ::operator*(m,v);
    bVar3 = ::operator*(m,v);
    local_258.m_floats._8_8_ = bVar3.m_floats._8_8_;
    local_258.m_floats._0_8_ = bVar3.m_floats._0_8_;
    btVector3::operator+=((btVector3 *)&stack0xfffffffffffffd88,&local_258);
    pbVar1 = btVector3::operator_cast_to_float_(local_248);
    *local_20 = *pbVar1;
    pbVar1 = btVector3::operator_cast_to_float_(local_248);
    local_20[1] = pbVar1[1];
    pbVar1 = btVector3::operator_cast_to_float_(local_248);
    local_20[2] = pbVar1[2];
    pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)&stack0xfffffffffffffd88);
    local_20[3] = *pbVar1;
    pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)&stack0xfffffffffffffd88);
    local_20[4] = pbVar1[1];
    pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)&stack0xfffffffffffffd88);
    local_20[5] = pbVar1[2];
  }
  return;
}

Assistant:

void btMultiBody::solveImatrix(const btVector3& rhs_top, const btVector3& rhs_bot, float result[6]) const
{
	int num_links = getNumLinks();
	///solve I * x = rhs, so the result = invI * rhs
    if (num_links == 0) 
	{
		// in the case of 0 m_links (i.e. a plain rigid body, not a multibody) rhs * invI is easier
        result[0] = rhs_bot[0] / m_baseInertia[0];
        result[1] = rhs_bot[1] / m_baseInertia[1];
        result[2] = rhs_bot[2] / m_baseInertia[2];
        result[3] = rhs_top[0] / m_baseMass;
        result[4] = rhs_top[1] / m_baseMass;
        result[5] = rhs_top[2] / m_baseMass;
    } else 
	{
		/// Special routine for calculating the inverse of a spatial inertia matrix
		///the 6x6 matrix is stored as 4 blocks of 3x3 matrices
		btMatrix3x3 Binv = m_cachedInertiaTopRight.inverse()*-1.f;
		btMatrix3x3 tmp = m_cachedInertiaLowerRight * Binv;
		btMatrix3x3 invIupper_right = (tmp * m_cachedInertiaTopLeft + m_cachedInertiaLowerLeft).inverse();
		tmp = invIupper_right * m_cachedInertiaLowerRight;
		btMatrix3x3 invI_upper_left = (tmp * Binv);
		btMatrix3x3 invI_lower_right = (invI_upper_left).transpose();
		tmp = m_cachedInertiaTopLeft  * invI_upper_left;
		tmp[0][0]-= 1.0;
		tmp[1][1]-= 1.0;
		tmp[2][2]-= 1.0;
		btMatrix3x3 invI_lower_left = (Binv * tmp);

		//multiply result = invI * rhs
		{
		  btVector3 vtop = invI_upper_left*rhs_top;
		  btVector3 tmp;
		  tmp = invIupper_right * rhs_bot;
		  vtop += tmp;
		  btVector3 vbot = invI_lower_left*rhs_top;
		  tmp = invI_lower_right * rhs_bot;
		  vbot += tmp;
		  result[0] = vtop[0];
		  result[1] = vtop[1];
		  result[2] = vtop[2];
		  result[3] = vbot[0];
		  result[4] = vbot[1];
		  result[5] = vbot[2];
		}
		
    }
}